

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_getopt_inner(nn_sock *self,int level,int option,void *optval,size_t *optvallen)

{
  int iVar1;
  size_t sVar2;
  char *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ulong *in_R8;
  nn_fd fd;
  int intval;
  nn_optset *optset;
  undefined8 in_stack_ffffffffffffff90;
  ulong __n;
  nn_sock *in_stack_ffffffffffffff98;
  size_t local_60;
  size_t local_50;
  nn_fd local_38;
  undefined4 local_34;
  nn_optset *local_30;
  size_t *local_28;
  char *local_20;
  int local_18;
  long local_10;
  
  if (0 < in_ESI) {
    if (*(long *)(**(long **)(in_RDI + 0x60) + 0x50) == 0) {
      return -0x5c;
    }
    iVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x50))
                      (*(undefined8 *)(in_RDI + 0x60),in_ESI,in_EDX,in_RCX,in_R8);
    return iVar1;
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  if (-1 < in_ESI) {
    if (in_ESI != 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","level == NN_SOL_SOCKET",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x1a1);
      fflush(_stderr);
      nn_err_abort();
    }
    switch(in_EDX) {
    case 1:
      local_34 = 0;
      break;
    case 2:
      local_34 = *(undefined4 *)(in_RDI + 0x140);
      break;
    case 3:
      local_34 = *(undefined4 *)(in_RDI + 0x144);
      break;
    case 4:
      local_34 = *(undefined4 *)(in_RDI + 0x14c);
      break;
    case 5:
      local_34 = *(undefined4 *)(in_RDI + 0x150);
      break;
    case 6:
      local_34 = *(undefined4 *)(in_RDI + 0x154);
      break;
    case 7:
      local_34 = *(undefined4 *)(in_RDI + 0x158);
      break;
    case 8:
      local_34 = *(undefined4 *)(in_RDI + 0x160);
      break;
    case 9:
      local_34 = *(undefined4 *)(in_RDI + 0x164);
      break;
    case 10:
      if ((*(uint *)(*(long *)(in_RDI + 0x68) + 8) & 2) != 0) {
        return -0x5c;
      }
      local_38 = nn_efd_getfd((nn_efd *)(in_RDI + 0xd0));
      if (*local_28 < 4) {
        local_50 = *local_28;
      }
      else {
        local_50 = 4;
      }
      memcpy(local_20,&local_38,local_50);
      *local_28 = 4;
      return 0;
    case 0xb:
      if ((*(uint *)(*(long *)(in_RDI + 0x68) + 8) & 1) != 0) {
        return -0x5c;
      }
      local_38 = nn_efd_getfd((nn_efd *)(in_RDI + 0xd4));
      if (*local_28 < 4) {
        local_60 = *local_28;
      }
      else {
        local_60 = 4;
      }
      memcpy(local_20,&local_38,local_60);
      *local_28 = 4;
      return 0;
    case 0xc:
      local_34 = **(undefined4 **)(in_RDI + 0x68);
      break;
    case 0xd:
      local_34 = *(undefined4 *)(*(long *)(in_RDI + 0x68) + 4);
      break;
    case 0xe:
      local_34 = *(undefined4 *)(in_RDI + 0x168);
      break;
    case 0xf:
      local_10 = in_RDI;
      strncpy(in_RCX,(char *)(in_RDI + 0x1f8),*in_R8);
      sVar2 = strlen((char *)(local_10 + 0x1f8));
      *local_28 = sVar2;
      return 0;
    case 0x10:
      local_34 = *(undefined4 *)(in_RDI + 0x148);
      break;
    case 0x11:
      local_34 = *(undefined4 *)(in_RDI + 0x15c);
      break;
    default:
      return -0x5c;
    }
    if (*in_R8 < 4) {
      __n = *in_R8;
    }
    else {
      __n = 4;
    }
    memcpy(in_RCX,&local_34,__n);
    *local_28 = 4;
    return 0;
  }
  local_18 = in_EDX;
  local_30 = nn_sock_optset(in_stack_ffffffffffffff98,
                            (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  if (local_30 == (nn_optset *)0x0) {
    return -0x5c;
  }
  iVar1 = (*local_30->vfptr->getopt)(local_30,local_18,local_20,local_28);
  return iVar1;
}

Assistant:

int nn_sock_getopt_inner (struct nn_sock *self, int level,
    int option, void *optval, size_t *optvallen)
{
    struct nn_optset *optset;
    int intval;
    nn_fd fd;

    /*  Protocol-specific socket options. */
    if (level > NN_SOL_SOCKET) {
        if (self->sockbase->vfptr->getopt == NULL) {
            return -ENOPROTOOPT;
        }
        return self->sockbase->vfptr->getopt (self->sockbase,
            level, option, optval, optvallen);
    }

    /*  Transport-specific options. */
    if (level < NN_SOL_SOCKET) {
        optset = nn_sock_optset (self, level);
        if (!optset)
            return -ENOPROTOOPT;
        return optset->vfptr->getopt (optset, option, optval, optvallen);
    }

    nn_assert (level == NN_SOL_SOCKET);

    /*  Generic socket-level options. */
    switch (option) {
    case NN_DOMAIN:
        intval = self->socktype->domain;
        break;
    case NN_PROTOCOL:
        intval = self->socktype->protocol;
        break;
    case NN_LINGER:
        intval = 0;
        break;
    case NN_SNDBUF:
        intval = self->sndbuf;
        break;
    case NN_RCVBUF:
        intval = self->rcvbuf;
        break;
    case NN_RCVMAXSIZE:
        intval = self->rcvmaxsize;
        break;
    case NN_SNDTIMEO:
        intval = self->sndtimeo;
        break;
    case NN_RCVTIMEO:
        intval = self->rcvtimeo;
        break;
    case NN_RECONNECT_IVL:
        intval = self->reconnect_ivl;
        break;
    case NN_RECONNECT_IVL_MAX:
        intval = self->reconnect_ivl_max;
        break;
    case NN_SNDPRIO:
        intval = self->ep_template.sndprio;
        break;
    case NN_RCVPRIO:
        intval = self->ep_template.rcvprio;
        break;
    case NN_IPV4ONLY:
        intval = self->ep_template.ipv4only;
        break;
    case NN_MAXTTL:
        intval = self->maxttl;
        break;
    case NN_SNDFD:
        if (self->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)
            return -ENOPROTOOPT;
        fd = nn_efd_getfd (&self->sndfd);
        memcpy (optval, &fd,
            *optvallen < sizeof (nn_fd) ? *optvallen : sizeof (nn_fd));
        *optvallen = sizeof (nn_fd);
        return 0;
    case NN_RCVFD:
        if (self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)
            return -ENOPROTOOPT;
        fd = nn_efd_getfd (&self->rcvfd);
        memcpy (optval, &fd,
            *optvallen < sizeof (nn_fd) ? *optvallen : sizeof (nn_fd));
        *optvallen = sizeof (nn_fd);
        return 0;
    case NN_SOCKET_NAME:
        strncpy (optval, self->socket_name, *optvallen);
        *optvallen = strlen(self->socket_name);
        return 0;
    default:
        return -ENOPROTOOPT;
    }

    memcpy (optval, &intval,
        *optvallen < sizeof (int) ? *optvallen : sizeof (int));
    *optvallen = sizeof (int);

    return 0;
}